

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O0

Result __thiscall
tonk::SessionOutgoing::QueueReliable
          (SessionOutgoing *this,uint messageType,uint8_t *data,size_t bytes)

{
  ErrorResult *this_00;
  Result *this_01;
  long in_RCX;
  ErrorResult *in_RDI;
  Result *in_R8;
  size_t written;
  OutgoingQueue *queue;
  Locker locker;
  uint queueIndex;
  Result *result;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  Locker *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  ErrorType in_stack_fffffffffffffeec;
  string *in_stack_fffffffffffffef0;
  size_t in_stack_fffffffffffffef8;
  uint8_t *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  ErrorResult *pEVar1;
  string local_a8 [32];
  string local_88 [32];
  Result *local_68;
  long local_60;
  undefined8 local_30;
  undefined4 local_24;
  string *local_20;
  char *local_18;
  
  pEVar1 = in_RDI;
  if (in_R8 < (Result *)0xfa01) {
    local_68 = in_R8;
    local_60 = in_RCX;
    Locker::Locker(in_stack_fffffffffffffee0,
                   (Lock *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    while (this_01 = (Result *)
                     OutgoingQueue::AppendSplitReliable
                               ((OutgoingQueue *)in_RDI,
                                (uint)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                                in_stack_ffffffffffffff00,in_stack_fffffffffffffef8),
          this_01 < local_68) {
      local_60 = (long)&this_01->Error + local_60;
      local_68 = (Result *)((long)local_68 - (long)this_01);
      OutgoingQueue::PushAndGetFreshBuffer((OutgoingQueue *)pEVar1);
      if (in_RDI->Source != (char *)0x0) goto LAB_00178611;
      Result::~Result(this_01);
    }
    Result::Success();
LAB_00178611:
    Locker::~Locker((Locker *)0x17861b);
  }
  else {
    std::__cxx11::to_string((unsigned_long)in_RDI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   (char *)in_stack_fffffffffffffee0);
    local_18 = "SessionOutgoing::QueueReliableMessage";
    local_20 = local_88;
    local_24 = 0;
    local_30 = 5;
    this_00 = (ErrorResult *)operator_new(0x38);
    ErrorResult::ErrorResult
              (this_00,(char *)in_RDI,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
               (ErrorCodeT)in_stack_fffffffffffffee0);
    in_RDI->Source = (char *)this_00;
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_a8);
  }
  return (Result)pEVar1;
}

Assistant:

Result SessionOutgoing::QueueReliable(
    unsigned messageType,
    const uint8_t* data,
    size_t bytes)
{
    // Note: Compressed type is generated internally by Flush()
    TONK_DEBUG_ASSERT(messageType > protocol::MessageType_Compressed);
    // Control/Unordered must be queued via QueueControl()/QueueUnordered()
    TONK_DEBUG_ASSERT(messageType < protocol::MessageType_Control);

    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    // Check for oversized messages without any additions up front to avoid
    // integer overflow issues
    if (bytes > TONK_MAX_RELIABLE_BYTES)
    {
        return Result("SessionOutgoing::QueueReliableMessage",
            std::to_string(bytes) + " byte message too large",
            ErrorType::Tonk,
            Tonk_MessageTooLarge);
    }

    const unsigned queueIndex = (messageType >= protocol::MessageType_LowPri)
        ? Queue_LowPri : Queue_Reliable;

    Locker locker(OutgoingQueueLock);

    OutgoingQueue* queue = &Queues[queueIndex];

    for (;;)
    {
        // Attempt to append message to OutBuffer
        const size_t written = queue->AppendSplitReliable(messageType, data, bytes);
        TONK_DEBUG_ASSERT(written <= bytes);
        if (written >= bytes) {
            break; // Done
        }

        data += written, bytes -= written;

        // Push the OutBuffer to the send queue and start a new OutBuffer
        const Result result = queue->PushAndGetFreshBuffer();
        if (result.IsFail()) {
            TONK_DEBUG_BREAK();
            return result;
        }
    }

    return Result::Success();
}